

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<false> * __thiscall
DefaultState<false>::EndObject(DefaultState<false> *this,Context<false> *ctx,SizeType memberCount)

{
  uint uVar1;
  example **ppeVar2;
  BaseState<false> *pBVar3;
  pointer pNVar4;
  stringstream *psVar5;
  ostream *poVar6;
  pointer pNVar7;
  
  pBVar3 = Context<false>::PopNamespace(ctx);
  pNVar4 = (ctx->namespace_path).
           super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar7 = (ctx->namespace_path).
           super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar4 == pNVar7) {
    uVar1 = (ctx->label_index_state).index;
    if (-1 < (int)uVar1) {
      ppeVar2 = ctx->examples->_begin;
      if ((int)((ulong)((long)ctx->examples->_end - (long)ppeVar2) >> 3) <= (int)(uVar1 + 1)) {
        psVar5 = Context<false>::error_abi_cxx11_(ctx);
        poVar6 = std::operator<<((ostream *)(psVar5 + 0x10),
                                 "Out of bounds error: _labelIndex must be smaller than number of actions! _labelIndex="
                                );
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
        poVar6 = std::operator<<(poVar6," Number of actions=");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::operator<<(poVar6," ");
        return (BaseState<false> *)0x0;
      }
      ctx->ex = ppeVar2[(ulong)uVar1 + 1];
      (ctx->label_index_state).index = -1;
    }
    LabelObjectState<false>::EndObject(&ctx->label_object_state,ctx,memberCount);
    pNVar4 = (ctx->namespace_path).
             super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pNVar7 = (ctx->namespace_path).
             super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (pNVar4 == pNVar7) {
    pBVar3 = ctx->root_state;
  }
  return pBVar3;
}

Assistant:

BaseState<audit>* EndObject(Context<audit>& ctx, rapidjson::SizeType memberCount)
  {
    BaseState<audit>* return_state = ctx.PopNamespace();

    if (ctx.namespace_path.empty())
    {
      int label_index = ctx.label_index_state.index;
      // we're at the end of the example
      if (label_index >= 0)
      {
        // skip shared example
        label_index++;
        if (label_index >= (int)ctx.examples->size())
        {
          ctx.error() << "Out of bounds error: _labelIndex must be smaller than number of actions! _labelIndex="
                      << (label_index - 1) << " Number of actions=" << ctx.examples->size() - 1 << " ";
          return nullptr;
        }

        // apply labelIndex
        ctx.ex = (*ctx.examples)[label_index];

        // reset for next example
        ctx.label_index_state.index = -1;
      }

      // inject label
      ctx.label_object_state.EndObject(ctx, memberCount);
    }

    // if we're at the top-level go back to ds_state
    return ctx.namespace_path.empty() ? ctx.root_state : return_state;
  }